

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::BaseLineCase
          (BaseLineCase *this,Context *context,char *name,char *desc,GLenum primitiveDrawType,
          PrimitiveWideness wideness,RenderTarget renderTarget,int numSamples)

{
  PrimitiveWideness wideness_local;
  GLenum primitiveDrawType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BaseLineCase *this_local;
  
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,context,name,desc,renderTarget,numSamples,0x100);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseLineCase_01592638;
  *(undefined4 *)&(this->super_BaseRenderingCase).field_0xc4 = 0;
  this->m_iterationCount = 3;
  this->m_primitiveDrawType = primitiveDrawType;
  this->m_primitiveWideness = wideness;
  this->m_allIterationsPassed = true;
  this->m_multisampleRelaxationRequired = false;
  this->m_maxLineWidth = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_lineWidths);
  return;
}

Assistant:

BaseLineCase::BaseLineCase (Context& context, const char* name, const char* desc, glw::GLenum primitiveDrawType, PrimitiveWideness wideness, BaseRenderingCase::RenderTarget renderTarget, int numSamples)
	: BaseRenderingCase					(context, name, desc, renderTarget, numSamples, DEFAULT_RENDER_SIZE)
	, m_iteration						(0)
	, m_iterationCount					(3)
	, m_primitiveDrawType				(primitiveDrawType)
	, m_primitiveWideness				(wideness)
	, m_allIterationsPassed				(true)
	, m_multisampleRelaxationRequired	(false)
	, m_maxLineWidth					(1.0f)
{
	DE_ASSERT(m_primitiveWideness < PRIMITIVEWIDENESS_LAST);
}